

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O3

bool __thiscall EthUdpPort::Init(EthUdpPort *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = SocketInternals::Open(this->sockPtr,&this->ServerIP,&this->MulticastIP,this->UDP_port);
  if ((bVar1) &&
     (iVar2 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[3])(this),
     (char)iVar2 != '\0')) {
    BasePort::SetDefaultProtocol((BasePort *)this);
    if ((this->super_EthBasePort).useFwBridge != true) {
      return true;
    }
    EthBasePort::OptimizeFirewireGapCount(&this->super_EthBasePort);
    return true;
  }
  return false;
}

Assistant:

bool EthUdpPort::Init(void)
{
    if (!sockPtr->Open(ServerIP, MulticastIP, UDP_port))
        return false;

    bool ret = ScanNodes();

    if (ret) {
        SetDefaultProtocol();
        if (useFwBridge)
            OptimizeFirewireGapCount();
    }

    //if (!ret)
    //    sockPtr->Close();
    return ret;
}